

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O0

UINT8 __thiscall S98Player::UnloadFile(S98Player *this)

{
  S98Player *this_local;
  
  if ((this->_playState & 1) == 0) {
    this->_playState = '\0';
    this->_dLoad = (DATA_LOADER *)0x0;
    this->_fileData = (UINT8 *)0x0;
    (this->_fileHdr).fileVer = 0xff;
    (this->_fileHdr).dataOfs = 0;
    std::vector<S98_DEVICE,_std::allocator<S98_DEVICE>_>::clear(&this->_devHdrs);
    std::vector<S98Player::S98_CHIPDEV,_std::allocator<S98Player::S98_CHIPDEV>_>::clear
              (&this->_devices);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->_tagData);
    this_local._7_1_ = '\0';
  }
  else {
    this_local._7_1_ = 0xff;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 S98Player::UnloadFile(void)
{
	if (_playState & PLAYSTATE_PLAY)
		return 0xFF;
	
	_playState = 0x00;
	_dLoad = NULL;
	_fileData = NULL;
	_fileHdr.fileVer = 0xFF;
	_fileHdr.dataOfs = 0x00;
	_devHdrs.clear();
	_devices.clear();
	_tagData.clear();
	
	return 0x00;
}